

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

void makeRoomAtIndex(run_container_t *run,uint16_t index)

{
  ushort in_SI;
  int *in_RDI;
  _Bool in_stack_0000000b;
  undefined2 in_stack_0000000c;
  
  if (in_RDI[1] < *in_RDI + 1) {
    run_container_grow(run,_in_stack_0000000c,in_stack_0000000b);
  }
  memmove((void *)(*(long *)(in_RDI + 2) + 4 + (long)(int)(uint)in_SI * 4),
          (void *)(*(long *)(in_RDI + 2) + (long)(int)(uint)in_SI * 4),
          (long)(int)(*in_RDI - (uint)in_SI) << 2);
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

static inline void makeRoomAtIndex(run_container_t *run, uint16_t index) {
    /* This function calls realloc + memmove sequentially to move by one index.
     * Potentially copying twice the array.
     */
    if (run->n_runs + 1 > run->capacity)
        run_container_grow(run, run->n_runs + 1, true);
    memmove(run->runs + 1 + index, run->runs + index,
            (run->n_runs - index) * sizeof(rle16_t));
    run->n_runs++;
}